

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  int iVar9;
  ulong uVar10;
  float **ppfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  Geometry *pGVar16;
  RTCRayQueryContext *pRVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  uint auVar24 [1];
  undefined1 (*pauVar25) [16];
  int iVar26;
  int iVar27;
  undefined4 uVar28;
  long lVar29;
  RayHit *pRVar30;
  RayHit *pRVar31;
  ulong uVar32;
  long lVar33;
  undefined4 uVar34;
  ulong unaff_RBX;
  ulong uVar35;
  Scene *pSVar36;
  undefined8 uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  ulong uVar42;
  uint *puVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  uint uVar48;
  uint uVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar66;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar78;
  float fVar80;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar79;
  float fVar81;
  float fVar82;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar83;
  float fVar95;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar96;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar97;
  float fVar101;
  float fVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar103;
  float fVar104;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar115;
  float fVar117;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  uint uVar120;
  undefined1 auVar114 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  uint auVar142 [1];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_125c [8];
  uint uStack_1254;
  uint uStack_1250;
  undefined1 auStack_124c [20];
  ulong local_1238;
  ulong local_1230;
  undefined8 local_1228;
  ulong local_1220;
  undefined8 local_1218;
  uint auStack_1210 [1];
  uint auStack_120c [1];
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  float fStack_11f0;
  float fStack_11ec;
  RTCFilterFunctionNArguments local_11e8;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  float local_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float local_1184;
  float local_1180;
  float local_117c;
  float local_1178;
  undefined4 local_1174;
  uint local_1170;
  uint local_116c;
  uint local_1168;
  undefined8 local_1158;
  float fStack_1150;
  float fStack_114c;
  undefined8 local_1148;
  float fStack_1140;
  float fStack_113c;
  RTCIntersectArguments *local_1130;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 local_10d8 [16];
  float local_10c8 [4];
  float local_10b8 [4];
  float local_10a8 [4];
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  float local_1078 [4];
  undefined8 local_1068;
  float fStack_1060;
  float fStack_105c;
  undefined8 local_1058;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  Geometry *local_1038;
  RayHit *local_1030;
  ulong local_1028;
  ulong local_1020;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar41 = (undefined1 (*) [16])local_f68;
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_fd8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fb8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar104 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar67 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar78 = (ray->super_RayK<1>).dir.field_0.m128[2];
      fVar127 = (ray->super_RayK<1>).dir.field_0.m128[3];
      fVar126 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar125 = 0.0;
      if (0.0 <= fVar126) {
        fVar125 = fVar126;
      }
      fVar126 = (ray->super_RayK<1>).tfar;
      fVar107 = 0.0;
      if (0.0 <= fVar126) {
        fVar107 = fVar126;
      }
      uVar48 = -(uint)(1e-18 <= ABS(fVar104));
      uVar49 = -(uint)(1e-18 <= ABS(fVar67));
      auVar71._8_4_ = -(uint)(1e-18 <= ABS(fVar78));
      auVar71._12_4_ = -(uint)(1e-18 <= ABS(fVar127));
      auVar68._0_4_ = (uint)fVar104 & uVar48;
      auVar68._4_4_ = (uint)fVar67 & uVar49;
      auVar68._8_4_ = (uint)fVar78 & auVar71._8_4_;
      auVar68._12_4_ = (uint)fVar127 & auVar71._12_4_;
      auVar84._0_8_ = CONCAT44(~uVar49,~uVar48) & 0x219392ef219392ef;
      auVar84._8_4_ = ~auVar71._8_4_ & 0x219392ef;
      auVar84._12_4_ = ~auVar71._12_4_ & 0x219392ef;
      auVar84 = auVar84 | auVar68;
      auVar68 = rcpps(auVar68,auVar84);
      local_fe8 = auVar68._0_4_;
      fVar126 = auVar68._4_4_;
      local_1018 = auVar68._8_4_;
      local_fe8 = (1.0 - auVar84._0_4_ * local_fe8) * local_fe8 + local_fe8;
      fVar126 = (1.0 - auVar84._4_4_ * fVar126) * fVar126 + fVar126;
      local_1018 = (1.0 - auVar84._8_4_ * local_1018) * local_1018 + local_1018;
      local_fa8._4_4_ = fVar126;
      local_fa8._0_4_ = fVar126;
      fStack_fa0 = fVar126;
      fStack_f9c = fVar126;
      uVar38 = (ulong)(local_fe8 < 0.0) << 4;
      local_1020 = (ulong)(fVar126 < 0.0) << 4 | 0x20;
      local_1028 = (ulong)(local_1018 < 0.0) << 4 | 0x40;
      local_1008._4_4_ = fVar125;
      local_1008._0_4_ = fVar125;
      local_1008._8_4_ = fVar125;
      local_1008._12_4_ = fVar125;
      local_1220 = uVar38 ^ 0x10;
      local_1228 = local_1020 ^ 0x10;
      local_1230 = local_1028 ^ 0x10;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      _local_1048 = mm_lookupmask_ps._240_8_;
      _uStack_1040 = mm_lookupmask_ps._248_8_;
      uVar32 = local_1028;
      uVar35 = uVar38 ^ 0x10;
      uVar37 = local_1020 ^ 0x10;
      uVar42 = local_1020;
      uVar46 = local_1028 ^ 0x10;
      fVar126 = fVar107;
      fVar125 = fVar107;
      fVar104 = fVar107;
      auVar68 = local_1008;
      fVar67 = local_fb8;
      fVar78 = local_fb8;
      fVar127 = local_fb8;
      fVar96 = local_fb8;
      fVar79 = local_fc8;
      fVar80 = local_fc8;
      fVar128 = local_fc8;
      fVar108 = local_fc8;
      fVar82 = local_fd8;
      fVar129 = local_fd8;
      fVar109 = local_fd8;
      fVar133 = local_fd8;
      fVar130 = local_fe8;
      fVar111 = local_fe8;
      fVar116 = local_fe8;
      fVar23 = local_fe8;
      fVar118 = local_1018;
      fVar81 = local_1018;
      fVar50 = local_1018;
      fVar51 = local_1018;
      do {
        do {
          do {
            if (pauVar41 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar25 = pauVar41 + -1;
            pauVar41 = pauVar41 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar25 + 8));
          uVar45 = *(ulong *)*pauVar41;
          do {
            if ((uVar45 & 8) == 0) {
              pfVar8 = (float *)(uVar45 + 0x20 + uVar38);
              auVar106._0_4_ = (*pfVar8 - fVar79) * fVar130;
              auVar106._4_4_ = (pfVar8[1] - fVar80) * fVar111;
              auVar106._8_4_ = (pfVar8[2] - fVar128) * fVar116;
              auVar106._12_4_ = (pfVar8[3] - fVar108) * fVar23;
              pfVar8 = (float *)(uVar45 + 0x20 + uVar42);
              auVar69._0_4_ = (*pfVar8 - fVar82) * (float)local_fa8._0_4_;
              auVar69._4_4_ = (pfVar8[1] - fVar129) * (float)local_fa8._4_4_;
              auVar69._8_4_ = (pfVar8[2] - fVar109) * fStack_fa0;
              auVar69._12_4_ = (pfVar8[3] - fVar133) * fStack_f9c;
              auVar84 = maxps(auVar106,auVar69);
              pfVar8 = (float *)(uVar45 + 0x20 + uVar32);
              auVar70._0_4_ = (*pfVar8 - fVar67) * fVar118;
              auVar70._4_4_ = (pfVar8[1] - fVar78) * fVar81;
              auVar70._8_4_ = (pfVar8[2] - fVar127) * fVar50;
              auVar70._12_4_ = (pfVar8[3] - fVar96) * fVar51;
              auVar71 = maxps(auVar70,auVar68);
              _local_1128 = maxps(auVar84,auVar71);
              pfVar8 = (float *)(uVar45 + 0x20 + uVar35);
              auVar72._0_4_ = (*pfVar8 - fVar79) * fVar130;
              auVar72._4_4_ = (pfVar8[1] - fVar80) * fVar111;
              auVar72._8_4_ = (pfVar8[2] - fVar128) * fVar116;
              auVar72._12_4_ = (pfVar8[3] - fVar108) * fVar23;
              pfVar8 = (float *)(uVar45 + 0x20 + uVar37);
              auVar85._0_4_ = (*pfVar8 - fVar82) * (float)local_fa8._0_4_;
              auVar85._4_4_ = (pfVar8[1] - fVar129) * (float)local_fa8._4_4_;
              auVar85._8_4_ = (pfVar8[2] - fVar109) * fStack_fa0;
              auVar85._12_4_ = (pfVar8[3] - fVar133) * fStack_f9c;
              auVar84 = minps(auVar72,auVar85);
              pfVar8 = (float *)(uVar45 + 0x20 + uVar46);
              auVar86._0_4_ = (*pfVar8 - fVar67) * fVar118;
              auVar86._4_4_ = (pfVar8[1] - fVar78) * fVar81;
              auVar86._8_4_ = (pfVar8[2] - fVar127) * fVar50;
              auVar86._12_4_ = (pfVar8[3] - fVar96) * fVar51;
              auVar88._4_4_ = fVar126;
              auVar88._0_4_ = fVar107;
              auVar88._8_4_ = fVar125;
              auVar88._12_4_ = fVar104;
              auVar71 = minps(auVar86,auVar88);
              auVar84 = minps(auVar84,auVar71);
              auVar113._4_4_ = -(uint)(local_1128._4_4_ <= auVar84._4_4_);
              auVar113._0_4_ = -(uint)(local_1128._0_4_ <= auVar84._0_4_);
              auVar113._8_4_ = -(uint)(local_1128._8_4_ <= auVar84._8_4_);
              auVar113._12_4_ = -(uint)(local_1128._12_4_ <= auVar84._12_4_);
              uVar34 = movmskps((int)unaff_RBX,auVar113);
              unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar34);
            }
            if ((uVar45 & 8) == 0) {
              if (unaff_RBX == 0) {
                iVar27 = 4;
              }
              else {
                uVar44 = uVar45 & 0xfffffffffffffff0;
                lVar40 = 0;
                if (unaff_RBX != 0) {
                  for (; (unaff_RBX >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                  }
                }
                iVar27 = 0;
                iVar26 = 0;
                uVar45 = *(ulong *)(uVar44 + lVar40 * 8);
                uVar39 = unaff_RBX - 1 & unaff_RBX;
                if (uVar39 != 0) {
                  uVar48 = *(uint *)(local_1128 + lVar40 * 4);
                  lVar40 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                    }
                  }
                  uVar10 = *(ulong *)(uVar44 + lVar40 * 8);
                  uVar49 = *(uint *)(local_1128 + lVar40 * 4);
                  uVar39 = uVar39 - 1 & uVar39;
                  uVar35 = local_1220;
                  uVar37 = local_1228;
                  uVar46 = local_1230;
                  iVar27 = iVar26;
                  if (uVar39 == 0) {
                    if (uVar48 < uVar49) {
                      *(ulong *)*pauVar41 = uVar10;
                      *(uint *)((long)*pauVar41 + 8) = uVar49;
                      pauVar41 = pauVar41 + 1;
                    }
                    else {
                      *(ulong *)*pauVar41 = uVar45;
                      *(uint *)((long)*pauVar41 + 8) = uVar48;
                      pauVar41 = pauVar41 + 1;
                      uVar45 = uVar10;
                    }
                  }
                  else {
                    auVar55._8_4_ = uVar48;
                    auVar55._0_8_ = uVar45;
                    auVar55._12_4_ = 0;
                    auVar73._8_4_ = uVar49;
                    auVar73._0_8_ = uVar10;
                    auVar73._12_4_ = 0;
                    lVar40 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                      }
                    }
                    uVar45 = *(ulong *)(uVar44 + lVar40 * 8);
                    iVar26 = *(int *)(local_1128 + lVar40 * 4);
                    auVar87._8_4_ = iVar26;
                    auVar87._0_8_ = uVar45;
                    auVar87._12_4_ = 0;
                    auVar98._8_4_ = -(uint)((int)uVar48 < (int)uVar49);
                    uVar39 = uVar39 - 1 & uVar39;
                    if (uVar39 == 0) {
                      auVar98._4_4_ = auVar98._8_4_;
                      auVar98._0_4_ = auVar98._8_4_;
                      auVar98._12_4_ = auVar98._8_4_;
                      auVar84 = auVar55 & auVar98 | ~auVar98 & auVar73;
                      auVar71 = auVar73 & auVar98 | ~auVar98 & auVar55;
                      auVar99._8_4_ = -(uint)(auVar84._8_4_ < iVar26);
                      auVar99._0_8_ = CONCAT44(auVar99._8_4_,auVar99._8_4_);
                      auVar99._12_4_ = auVar99._8_4_;
                      auVar88 = auVar87 & auVar99 | ~auVar99 & auVar84;
                      auVar56._8_4_ = -(uint)(auVar71._8_4_ < auVar88._8_4_);
                      auVar56._4_4_ = auVar56._8_4_;
                      auVar56._0_4_ = auVar56._8_4_;
                      auVar56._12_4_ = auVar56._8_4_;
                      *pauVar41 = ~auVar56 & auVar71 | auVar88 & auVar56;
                      pauVar41[1] = auVar71 & auVar56 | ~auVar56 & auVar88;
                      pauVar41 = pauVar41 + 2;
                      uVar45 = ~auVar99._0_8_ & uVar45 | auVar84._0_8_ & auVar99._0_8_;
                    }
                    else {
                      lVar40 = 0;
                      if (uVar39 != 0) {
                        for (; (uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                        }
                      }
                      iVar9 = *(int *)(local_1128 + lVar40 * 4);
                      auVar105._8_4_ = iVar9;
                      auVar105._0_8_ = *(undefined8 *)(uVar44 + lVar40 * 8);
                      auVar105._12_4_ = 0;
                      auVar100._4_4_ = auVar98._8_4_;
                      auVar100._0_4_ = auVar98._8_4_;
                      auVar100._8_4_ = auVar98._8_4_;
                      auVar100._12_4_ = auVar98._8_4_;
                      auVar68 = auVar55 & auVar100 | ~auVar100 & auVar73;
                      auVar84 = auVar73 & auVar100 | ~auVar100 & auVar55;
                      auVar112._0_4_ = -(uint)(iVar26 < iVar9);
                      auVar112._4_4_ = -(uint)(iVar26 < iVar9);
                      auVar112._8_4_ = -(uint)(iVar26 < iVar9);
                      auVar112._12_4_ = -(uint)(iVar26 < iVar9);
                      auVar88 = auVar87 & auVar112 | ~auVar112 & auVar105;
                      auVar113 = ~auVar112 & auVar87 | auVar105 & auVar112;
                      auVar89._8_4_ = -(uint)(auVar84._8_4_ < auVar113._8_4_);
                      auVar89._4_4_ = auVar89._8_4_;
                      auVar89._0_4_ = auVar89._8_4_;
                      auVar89._12_4_ = auVar89._8_4_;
                      auVar106 = auVar84 & auVar89 | ~auVar89 & auVar113;
                      auVar74._8_4_ = -(uint)(auVar68._8_4_ < auVar88._8_4_);
                      auVar74._0_8_ = CONCAT44(auVar74._8_4_,auVar74._8_4_);
                      auVar74._12_4_ = auVar74._8_4_;
                      auVar71 = ~auVar74 & auVar68 | auVar88 & auVar74;
                      auVar57._8_4_ = -(uint)(auVar71._8_4_ < auVar106._8_4_);
                      auVar57._4_4_ = auVar57._8_4_;
                      auVar57._0_4_ = auVar57._8_4_;
                      auVar57._12_4_ = auVar57._8_4_;
                      *pauVar41 = ~auVar89 & auVar84 | auVar113 & auVar89;
                      pauVar41[1] = ~auVar57 & auVar71 | auVar106 & auVar57;
                      pauVar41[2] = auVar71 & auVar57 | ~auVar57 & auVar106;
                      pauVar41 = pauVar41 + 3;
                      uVar45 = auVar68._0_8_ & auVar74._0_8_ | ~auVar74._0_8_ & auVar88._0_8_;
                      auVar68 = local_1008;
                      fVar118 = local_1018;
                      fVar81 = fStack_1014;
                      fVar50 = fStack_1010;
                      fVar51 = fStack_100c;
                    }
                  }
                }
              }
            }
            else {
              iVar27 = 6;
            }
          } while (iVar27 == 0);
        } while (iVar27 != 6);
        lVar40 = (ulong)((uint)uVar45 & 0xf) - 8;
        if (lVar40 != 0) {
          lVar47 = 0;
          do {
            lVar29 = lVar47 * 0x60;
            pSVar36 = context->scene;
            puVar1 = (uint *)(lVar29 + (uVar45 & 0xfffffffffffffff0));
            puVar43 = puVar1 + 0x10;
            ppfVar11 = (pSVar36->vertices).items;
            pfVar12 = ppfVar11[*puVar43];
            pfVar8 = pfVar12 + *puVar1;
            fVar126 = *pfVar8;
            fVar125 = pfVar8[1];
            fVar104 = pfVar8[2];
            pfVar8 = pfVar12 + puVar1[4];
            pfVar2 = pfVar12 + puVar1[8];
            fVar23 = pfVar2[2];
            auVar24[0] = (uint)pfVar2[3];
            auStack_1210[0] = (uint)fVar23;
            auStack_120c[0] = auVar24[0];
            pfVar12 = pfVar12 + puVar1[0xc];
            fVar67 = pfVar12[1];
            pfVar13 = ppfVar11[puVar1[0x11]];
            pfVar3 = pfVar13 + puVar1[1];
            fVar78 = *pfVar3;
            fVar127 = pfVar3[1];
            fVar107 = pfVar3[2];
            pfVar3 = pfVar13 + puVar1[5];
            pfVar4 = pfVar13 + puVar1[9];
            fVar96 = pfVar4[2];
            pfVar13 = pfVar13 + puVar1[0xd];
            fVar79 = pfVar13[1];
            pfVar14 = ppfVar11[puVar1[0x12]];
            pfVar5 = pfVar14 + puVar1[2];
            fVar80 = *pfVar5;
            fVar128 = pfVar5[1];
            fVar108 = pfVar5[2];
            pfVar5 = pfVar14 + puVar1[6];
            uVar37 = *(undefined8 *)(pfVar14 + puVar1[0xe]);
            pfVar15 = ppfVar11[puVar1[0x13]];
            pfVar6 = pfVar15 + puVar1[3];
            fVar82 = *pfVar6;
            fVar129 = pfVar6[1];
            fVar109 = pfVar6[2];
            pfVar6 = pfVar15 + puVar1[7];
            pfVar7 = pfVar15 + puVar1[0xf];
            fStack_1044 = *pfVar7;
            fStack_118c = pfVar7[1];
            local_ff8 = pfVar8[2];
            fStack_ff4 = pfVar3[2];
            fStack_ff0 = pfVar5[2];
            fStack_fec = pfVar6[2];
            local_1068._0_4_ = *pfVar8;
            local_1068._4_4_ = *pfVar3;
            fStack_1060 = *pfVar5;
            fStack_105c = *pfVar6;
            local_1218._0_4_ = (float)*(undefined8 *)pfVar2;
            uVar48 = (uint)(float)local_1218;
            local_1218._4_4_ = (float)((ulong)*(undefined8 *)pfVar2 >> 0x20);
            local_1148._0_4_ = local_1218._4_4_;
            local_1218._0_4_ = fVar23;
            local_1218._4_4_ = fVar96;
            local_1158 = CONCAT44(*pfVar4,uVar48);
            local_1148._4_4_ = pfVar4[1];
            fStack_1140 = pfVar14[(ulong)puVar1[10] + 1];
            fStack_113c = pfVar15[(ulong)puVar1[0xb] + 1];
            local_1198 = (float)uVar37;
            fVar118 = local_1198;
            fStack_1194 = (float)((ulong)uVar37 >> 0x20);
            fVar81 = fStack_1194;
            fStack_1190 = (float)*(undefined8 *)(pfVar14 + puVar1[0xe] + 2);
            fStack_f90 = fStack_1190;
            local_1058 = CONCAT44(*pfVar13,*pfVar12);
            local_1048 = local_1198;
            _local_1198 = CONCAT44(fVar79,fVar67);
            _fStack_1190 = CONCAT44(fStack_118c,fVar81);
            local_f88 = pfVar8[1];
            fStack_f84 = pfVar3[1];
            fStack_f80 = pfVar5[1];
            fStack_f7c = pfVar6[1];
            fVar50 = fVar125 - pfVar8[1];
            fVar51 = fVar127 - pfVar3[1];
            fVar52 = fVar128 - pfVar5[1];
            fVar53 = fVar129 - pfVar6[1];
            fVar134 = fVar104 - pfVar8[2];
            fVar136 = fVar107 - pfVar3[2];
            fVar138 = fVar108 - pfVar5[2];
            fVar140 = fVar109 - pfVar6[2];
            fVar110 = fVar67 - fVar125;
            fVar115 = fVar79 - fVar127;
            fVar117 = fVar81 - fVar128;
            fVar119 = fStack_118c - fVar129;
            local_f98 = pfVar12[2];
            fStack_f94 = pfVar13[2];
            fStack_f8c = pfVar7[2];
            fVar121 = pfVar12[2] - fVar104;
            fVar122 = pfVar13[2] - fVar107;
            fVar123 = fStack_f90 - fVar108;
            fVar124 = pfVar7[2] - fVar109;
            fVar83 = fVar134 * fVar110 - fVar50 * fVar121;
            fVar95 = fVar136 * fVar115 - fVar51 * fVar122;
            fStack_11f0 = fVar138 * fVar117 - fVar52 * fVar123;
            fStack_11ec = fVar140 * fVar119 - fVar53 * fVar124;
            fVar97 = *pfVar12 - fVar126;
            fVar101 = *pfVar13 - fVar78;
            fVar102 = fVar118 - fVar80;
            fVar103 = fStack_1044 - fVar82;
            fStack_11ac = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar133 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar130 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar54 = fVar126 - fStack_11ac;
            fVar66 = fVar78 - fStack_11ac;
            fStack_11b0 = fVar80 - fStack_11ac;
            fStack_11ac = fVar82 - fStack_11ac;
            fVar125 = fVar125 - fVar133;
            fVar127 = fVar127 - fVar133;
            fVar128 = fVar128 - fVar133;
            fVar129 = fVar129 - fVar133;
            fVar133 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar111 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar116 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar147 = fVar54 * fVar111 - fVar125 * fVar133;
            fVar148 = fVar66 * fVar111 - fVar127 * fVar133;
            fVar149 = fStack_11b0 * fVar111 - fVar128 * fVar133;
            fVar150 = fStack_11ac * fVar111 - fVar129 * fVar133;
            fVar126 = fVar126 - *pfVar8;
            fVar78 = fVar78 - *pfVar3;
            fVar80 = fVar80 - *pfVar5;
            fVar82 = fVar82 - *pfVar6;
            local_1208 = fVar126 * fVar121 - fVar134 * fVar97;
            fStack_1204 = fVar78 * fVar122 - fVar136 * fVar101;
            fStack_1200 = fVar80 * fVar123 - fVar138 * fVar102;
            fStack_11fc = fVar82 * fVar124 - fVar140 * fVar103;
            fVar104 = fVar104 - fVar130;
            fVar107 = fVar107 - fVar130;
            fVar108 = fVar108 - fVar130;
            fVar109 = fVar109 - fVar130;
            local_11b8 = CONCAT44(fVar66,fVar54);
            fVar143 = fVar104 * fVar133 - fVar54 * fVar116;
            fVar144 = fVar107 * fVar133 - fVar66 * fVar116;
            fVar145 = fVar108 * fVar133 - fStack_11b0 * fVar116;
            fVar146 = fVar109 * fVar133 - fStack_11ac * fVar116;
            local_1078[0] = fVar50 * fVar97 - fVar126 * fVar110;
            local_1078[1] = fVar51 * fVar101 - fVar78 * fVar115;
            local_1078[2] = fVar52 * fVar102 - fVar80 * fVar117;
            local_1078[3] = fVar53 * fVar103 - fVar82 * fVar119;
            fVar135 = fVar125 * fVar116 - fVar104 * fVar111;
            fVar137 = fVar127 * fVar116 - fVar107 * fVar111;
            fVar139 = fVar128 * fVar116 - fVar108 * fVar111;
            fVar141 = fVar129 * fVar116 - fVar109 * fVar111;
            local_11f8 = (RayQueryContext *)CONCAT44(fVar95,fVar83);
            fVar130 = fVar133 * fVar83 + fVar111 * local_1208 + fVar116 * local_1078[0];
            fVar131 = fVar133 * fVar95 + fVar111 * fStack_1204 + fVar116 * local_1078[1];
            fVar132 = fVar133 * fStack_11f0 + fVar111 * fStack_1200 + fVar116 * local_1078[2];
            fVar133 = fVar133 * fStack_11ec + fVar111 * fStack_11fc + fVar116 * local_1078[3];
            uVar49 = (uint)fVar130 & 0x80000000;
            auVar71._8_4_ = (uint)fVar131 & 0x80000000;
            auVar71._12_4_ = (uint)fVar132 & 0x80000000;
            uVar120 = (uint)fVar133 & 0x80000000;
            local_1128._0_4_ =
                 (uint)(fVar97 * fVar135 + fVar110 * fVar143 + fVar121 * fVar147) ^ uVar49;
            local_1128._4_4_ =
                 (uint)(fVar101 * fVar137 + fVar115 * fVar144 + fVar122 * fVar148) ^ auVar71._8_4_;
            fStack_1120 = (float)((uint)(fVar102 * fVar139 + fVar117 * fVar145 + fVar123 * fVar149)
                                 ^ auVar71._12_4_);
            fStack_111c = (float)((uint)(fVar103 * fVar141 + fVar119 * fVar146 + fVar124 * fVar150)
                                 ^ uVar120);
            local_1118 = (float)((uint)(fVar135 * fVar126 + fVar143 * fVar50 + fVar147 * fVar134) ^
                                uVar49);
            fStack_1114 = (float)((uint)(fVar137 * fVar78 + fVar144 * fVar51 + fVar148 * fVar136) ^
                                 auVar71._8_4_);
            fStack_1110 = (float)((uint)(fVar139 * fVar80 + fVar145 * fVar52 + fVar149 * fVar138) ^
                                 auVar71._12_4_);
            fStack_110c = (float)((uint)(fVar141 * fVar82 + fVar146 * fVar53 + fVar150 * fVar140) ^
                                 uVar120);
            fVar126 = ABS(fVar130);
            fVar78 = ABS(fVar131);
            local_10f8._0_8_ = CONCAT44(fVar131,fVar130) & 0x7fffffff7fffffff;
            local_10f8._8_4_ = ABS(fVar132);
            local_10f8._12_4_ = ABS(fVar133);
            local_10d8._0_4_ =
                 -(uint)((0.0 <= local_1118 && 0.0 <= (float)local_1128._0_4_) && fVar130 != 0.0) &
                 (uint)fVar118 & -(uint)((float)local_1128._0_4_ + local_1118 <= fVar126);
            local_10d8._4_4_ =
                 -(uint)((0.0 <= fStack_1114 && 0.0 <= (float)local_1128._4_4_) && fVar131 != 0.0) &
                 (uint)fStack_1044 & -(uint)((float)local_1128._4_4_ + fStack_1114 <= fVar78);
            local_10d8._8_4_ =
                 -(uint)((0.0 <= fStack_1110 && 0.0 <= fStack_1120) && fVar132 != 0.0) & uStack_1040
                 & -(uint)(fStack_1120 + fStack_1110 <= local_10f8._8_4_);
            local_10d8._12_4_ =
                 -(uint)((0.0 <= fStack_110c && 0.0 <= fStack_111c) && fVar133 != 0.0) & uStack_103c
                 & -(uint)(fStack_111c + fStack_110c <= local_10f8._12_4_);
            lVar33 = lVar29 + (uVar45 & 0xfffffffffffffff0);
            uVar34 = (undefined4)((ulong)lVar29 >> 0x20);
            auVar22._4_4_ = local_10d8._4_4_;
            auVar22._0_4_ = local_10d8._0_4_;
            auVar22._8_4_ = local_10d8._8_4_;
            auVar22._12_4_ = local_10d8._12_4_;
            uVar48 = movmskps((int)lVar29,auVar22);
            auVar142[0] = (uint)fVar23;
            if (uVar48 != 0) {
              local_1108 = (float)(uVar49 ^ (uint)(fVar54 * fVar83 +
                                                  fVar125 * local_1208 + fVar104 * local_1078[0]));
              fStack_1104 = (float)(auVar71._8_4_ ^
                                   (uint)(fVar66 * fVar95 +
                                         fVar127 * fStack_1204 + fVar107 * local_1078[1]));
              fStack_1100 = (float)(auVar71._12_4_ ^
                                   (uint)(fStack_11b0 * fStack_11f0 +
                                         fVar128 * fStack_1200 + fVar108 * local_1078[2]));
              fStack_10fc = (float)(uVar120 ^
                                   (uint)(fStack_11ac * fStack_11ec +
                                         fVar129 * fStack_11fc + fVar109 * local_1078[3]));
              fVar125 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar104 = (ray->super_RayK<1>).tfar;
              local_10d8._0_4_ =
                   -(uint)(local_1108 <= fVar104 * fVar126 && fVar125 * fVar126 < local_1108) &
                   local_10d8._0_4_;
              local_10d8._4_4_ =
                   -(uint)(fStack_1104 <= fVar104 * fVar78 && fVar125 * fVar78 < fStack_1104) &
                   local_10d8._4_4_;
              local_10d8._8_4_ =
                   -(uint)(fStack_1100 <= fVar104 * local_10f8._8_4_ &&
                          fVar125 * local_10f8._8_4_ < fStack_1100) & local_10d8._8_4_;
              local_10d8._12_4_ =
                   -(uint)(fStack_10fc <= fVar104 * local_10f8._12_4_ &&
                          fVar125 * local_10f8._12_4_ < fStack_10fc) & local_10d8._12_4_;
              auVar20._4_4_ = local_10d8._4_4_;
              auVar20._0_4_ = local_10d8._0_4_;
              auVar20._8_4_ = local_10d8._8_4_;
              auVar20._12_4_ = local_10d8._12_4_;
              uVar48 = movmskps(uVar48,auVar20);
              if (uVar48 != 0) {
                local_11b8 = lVar33;
                local_1098 = local_11f8;
                uStack_1090 = CONCAT44(fStack_11ec,fStack_11f0);
                local_1088._4_4_ = fStack_1204;
                local_1088._0_4_ = local_1208;
                fStack_1080 = fStack_1200;
                fStack_107c = fStack_11fc;
                uStack_1254 = local_10d8._4_4_;
                local_125c._4_4_ = local_10d8._0_4_;
                uStack_1250 = local_10d8._8_4_;
                auStack_124c._0_4_ = local_10d8._12_4_;
                auVar68 = rcpps(_local_1088,local_10f8);
                fVar125 = auVar68._0_4_;
                fVar104 = auVar68._4_4_;
                fVar67 = auVar68._8_4_;
                fVar127 = auVar68._12_4_;
                fVar125 = (1.0 - fVar126 * fVar125) * fVar125 + fVar125;
                fVar104 = (1.0 - fVar78 * fVar104) * fVar104 + fVar104;
                fVar67 = (1.0 - local_10f8._8_4_ * fVar67) * fVar67 + fVar67;
                fVar127 = (1.0 - local_10f8._12_4_ * fVar127) * fVar127 + fVar127;
                local_10a8[0] = local_1108 * fVar125;
                local_10a8[1] = fStack_1104 * fVar104;
                local_10a8[2] = fStack_1100 * fVar67;
                local_10a8[3] = fStack_10fc * fVar127;
                local_10c8[0] = (float)local_1128._0_4_ * fVar125;
                local_10c8[1] = (float)local_1128._4_4_ * fVar104;
                local_10c8[2] = fStack_1120 * fVar67;
                local_10c8[3] = fStack_111c * fVar127;
                local_10b8[0] = fVar125 * local_1118;
                local_10b8[1] = fVar104 * fStack_1114;
                local_10b8[2] = fVar67 * fStack_1110;
                local_10b8[3] = fVar127 * fStack_110c;
                auVar58._0_4_ = (uint)(local_1108 * fVar125) & local_10d8._0_4_;
                auVar58._4_4_ = (uint)(fStack_1104 * fVar104) & local_10d8._4_4_;
                auVar58._8_4_ = (uint)(fStack_1100 * fVar67) & local_10d8._8_4_;
                auVar58._12_4_ = (uint)(fStack_10fc * fVar127) & local_10d8._12_4_;
                auVar75._0_8_ = CONCAT44(~local_10d8._4_4_,~local_10d8._0_4_) & 0x7f8000007f800000;
                auVar75._8_4_ = ~local_10d8._8_4_ & 0x7f800000;
                auVar75._12_4_ = ~local_10d8._12_4_ & 0x7f800000;
                auVar75 = auVar75 | auVar58;
                auVar91._4_4_ = auVar75._0_4_;
                auVar91._0_4_ = auVar75._4_4_;
                auVar91._8_4_ = auVar75._12_4_;
                auVar91._12_4_ = auVar75._8_4_;
                auVar68 = minps(auVar91,auVar75);
                auVar59._0_8_ = auVar68._8_8_;
                auVar59._8_4_ = auVar68._0_4_;
                auVar59._12_4_ = auVar68._4_4_;
                auVar68 = minps(auVar59,auVar68);
                auVar60._0_4_ = -(uint)(auVar68._0_4_ == auVar75._0_4_) & local_10d8._0_4_;
                auVar60._4_4_ = -(uint)(auVar68._4_4_ == auVar75._4_4_) & local_10d8._4_4_;
                auVar60._8_4_ = -(uint)(auVar68._8_4_ == auVar75._8_4_) & local_10d8._8_4_;
                auVar60._12_4_ = -(uint)(auVar68._12_4_ == auVar75._12_4_) & local_10d8._12_4_;
                iVar27 = movmskps(uVar48,auVar60);
                uVar48 = local_10d8._0_4_;
                uVar49 = local_10d8._4_4_;
                auVar71._8_4_ = local_10d8._8_4_;
                auVar71._12_4_ = local_10d8._12_4_;
                if (iVar27 != 0) {
                  uVar48 = auVar60._0_4_;
                  uVar49 = auVar60._4_4_;
                  auVar71._8_4_ = auVar60._8_4_;
                  auVar71._12_4_ = auVar60._12_4_;
                }
                auVar21._4_4_ = uVar49;
                auVar21._0_4_ = uVar48;
                auVar21._8_4_ = auVar71._8_4_;
                auVar21._12_4_ = auVar71._12_4_;
                uVar28 = movmskps(iVar27,auVar21);
                pRVar31 = (RayHit *)0x0;
                if (CONCAT44(uVar34,uVar28) != 0) {
                  for (; (CONCAT44(uVar34,uVar28) >> (long)pRVar31 & 1) == 0;
                      pRVar31 = (RayHit *)((long)(pRVar31->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
LAB_00df45ff:
                uVar48 = puVar43[(long)pRVar31];
                pRVar30 = (RayHit *)(ulong)uVar48;
                pGVar16 = (pSVar36->geometries).items[(long)pRVar30].ptr;
                if ((pGVar16->mask & (ray->super_RayK<1>).mask) == 0) {
                  *(undefined4 *)(local_125c + (long)pRVar31 * 4 + 4) = 0;
LAB_00df4820:
                  uVar34 = (undefined4)((ulong)pRVar30 >> 0x20);
                  uVar48 = movmskps((int)pRVar30,stack0xffffffffffffeda8);
                  if (uVar48 == 0) goto LAB_00df4d8b;
                  local_1208 = SUB84(pauVar41,0);
                  fStack_1204 = (float)((ulong)pauVar41 >> 0x20);
                  auStack_124c._12_8_ = lVar40;
                  local_1238 = uVar38;
                  local_11f8 = context;
                  BVHNIntersector1<4,1,false,embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Moeller<4,true>>>
                  ::intersect();
                  pauVar41 = (undefined1 (*) [16])CONCAT44(fStack_1204,local_1208);
                  pRVar31 = (RayHit *)local_11e8.valid;
                  uVar38 = local_1238;
                  lVar40 = auStack_124c._12_8_;
                  context = local_11f8;
                  goto LAB_00df45ff;
                }
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1130 = context->args;
                  auStack_124c._12_8_ = lVar40;
                  local_1238 = uVar38;
                  local_1208 = SUB84(pauVar41,0);
                  fStack_1204 = (float)((ulong)pauVar41 >> 0x20);
                  local_11f8 = context;
                  local_11e8.context = context->user;
                  local_1188 = *(float *)((long)&local_1098 + (long)pRVar31 * 4);
                  local_1184 = local_1078[(long)&pRVar31[-1].field_0x5c];
                  local_1180 = local_1078[(long)pRVar31];
                  local_117c = local_10c8[(long)pRVar31];
                  local_1178 = local_10b8[(long)pRVar31];
                  local_1174 = *(undefined4 *)(local_11b8 + 0x50 + (long)pRVar31 * 4);
                  local_1170 = uVar48;
                  local_116c = (local_11e8.context)->instID[0];
                  local_1168 = (local_11e8.context)->instPrimID[0];
                  local_119c = (ray->super_RayK<1>).tfar;
                  local_1030 = pRVar31;
                  (ray->super_RayK<1>).tfar = local_10a8[(long)pRVar31];
                  local_125c._0_4_ = -NAN;
                  local_11e8.valid = (int *)local_125c;
                  local_11e8.geometryUserPtr = pGVar16->userPtr;
                  local_11e8.ray = (RTCRayN *)ray;
                  local_11e8.hit = (RTCHitN *)&local_1188;
                  local_11e8.N = 1;
                  local_1038 = pGVar16;
                  if ((pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar16->intersectionFilterN)(&local_11e8),
                     (((RayK<1> *)local_11e8.valid)->org).field_0.m128[0] != 0.0)) {
                    if (local_1130->filter != (RTCFilterFunctionN)0x0) {
                      if (((local_1130->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((local_1038->field_8).field_0x2 & 0x40) != 0)) {
                        (*local_1130->filter)(&local_11e8);
                      }
                      if ((((RayK<1> *)local_11e8.valid)->org).field_0.m128[0] == 0.0)
                      goto LAB_00df4885;
                    }
                    (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_11e8.hit;
                    (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_11e8.hit + 4);
                    (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_11e8.hit + 8);
                    *(float *)((long)local_11e8.ray + 0x3c) = *(float *)(local_11e8.hit + 0xc);
                    *(float *)((long)local_11e8.ray + 0x40) = *(float *)(local_11e8.hit + 0x10);
                    *(float *)((long)local_11e8.ray + 0x44) = *(float *)(local_11e8.hit + 0x14);
                    *(float *)((long)local_11e8.ray + 0x48) = *(float *)(local_11e8.hit + 0x18);
                    *(float *)((long)local_11e8.ray + 0x4c) = *(float *)(local_11e8.hit + 0x1c);
                    *(float *)((long)local_11e8.ray + 0x50) = *(float *)(local_11e8.hit + 0x20);
                  }
                  else {
LAB_00df4885:
                    (ray->super_RayK<1>).tfar = local_119c;
                  }
                  pRVar30 = local_1030;
                  *(undefined4 *)(local_125c + (long)local_1030 * 4 + 4) = 0;
                  fVar126 = (ray->super_RayK<1>).tfar;
                  local_125c._4_4_ = -(uint)(local_10a8[0] <= fVar126) & local_125c._4_4_;
                  uStack_1254 = -(uint)(local_10a8[1] <= fVar126) & uStack_1254;
                  uStack_1250 = -(uint)(local_10a8[2] <= fVar126) & uStack_1250;
                  auStack_124c._0_4_ = -(uint)(local_10a8[3] <= fVar126) & auStack_124c._0_4_;
                  pauVar41 = (undefined1 (*) [16])CONCAT44(fStack_1204,local_1208);
                  uVar38 = local_1238;
                  lVar40 = auStack_124c._12_8_;
                  context = local_11f8;
                  goto LAB_00df4820;
                }
                fVar126 = local_10c8[(long)pRVar31];
                fVar125 = local_10b8[(long)pRVar31];
                (ray->super_RayK<1>).tfar = local_10a8[(long)pRVar31];
                (ray->Ng).field_0.field_0.x = *(float *)((long)&local_1098 + (long)pRVar31 * 4);
                (ray->Ng).field_0.field_0.y = local_1078[(long)&pRVar31[-1].field_0x5c];
                (ray->Ng).field_0.field_0.z = local_1078[(long)pRVar31];
                ray->u = fVar126;
                ray->v = fVar125;
                ray->primID = *(uint *)(local_11b8 + 0x50 + (long)pRVar31 * 4);
                ray->geomID = uVar48;
                pRVar17 = context->user;
                ray->instID[0] = pRVar17->instID[0];
                uVar48 = pRVar17->instPrimID[0];
                uVar34 = 0;
                ray->instPrimID[0] = uVar48;
LAB_00df4d8b:
                lVar33 = local_11b8;
                fVar67 = local_1198;
                fVar79 = fStack_1194;
                fVar81 = fStack_1190;
                fVar23 = (float)local_1218;
                fVar96 = local_1218._4_4_;
                auVar142[0] = auStack_1210[0];
                auVar24[0] = auStack_120c[0];
              }
            }
            local_1058._0_4_ = (float)local_1158 - (float)local_1058;
            local_1058._4_4_ = local_1158._4_4_ - local_1058._4_4_;
            fStack_1050 = fStack_1150 - fStack_1050;
            fStack_104c = fStack_114c - fStack_104c;
            fVar67 = (float)local_1148 - fVar67;
            fVar79 = local_1148._4_4_ - fVar79;
            fVar81 = fStack_1140 - fVar81;
            fStack_118c = fStack_113c - fStack_118c;
            fVar101 = fVar23 - local_f98;
            fVar102 = fVar96 - fStack_f94;
            fVar103 = (float)auVar142[0] - fStack_f90;
            fVar110 = (float)auVar24[0] - fStack_f8c;
            local_1068._0_4_ = (float)local_1068 - (float)local_1158;
            local_1068._4_4_ = local_1068._4_4_ - local_1158._4_4_;
            fVar95 = fStack_1060 - fStack_1150;
            fVar97 = fStack_105c - fStack_114c;
            fVar80 = local_f88 - (float)local_1148;
            fVar128 = fStack_f84 - local_1148._4_4_;
            fVar108 = fStack_f80 - fStack_1140;
            fVar82 = fStack_f7c - fStack_113c;
            fVar115 = local_ff8 - fVar23;
            fVar117 = fStack_ff4 - fVar96;
            fVar119 = fStack_ff0 - (float)auVar142[0];
            fVar121 = fStack_fec - (float)auVar24[0];
            _local_1198 = CONCAT44(fVar79,fVar67);
            _fStack_1190 = CONCAT44(fStack_118c,fVar81);
            fVar111 = fVar80 * fVar101 - fVar115 * fVar67;
            fVar116 = fVar128 * fVar102 - fVar117 * fVar79;
            fVar118 = fVar108 * fVar103 - fVar119 * fVar81;
            fVar50 = fVar82 * fVar110 - fVar121 * fStack_118c;
            local_1088._0_4_ = fVar115 * (float)local_1058 - (float)local_1068 * fVar101;
            local_1088._4_4_ = fVar117 * local_1058._4_4_ - local_1068._4_4_ * fVar102;
            fStack_1080 = fVar119 * fStack_1050 - fVar95 * fVar103;
            fStack_107c = fVar121 * fStack_104c - fVar97 * fVar110;
            local_1078[0] = (float)local_1068 * fVar67 - fVar80 * (float)local_1058;
            local_1078[1] = local_1068._4_4_ * fVar79 - fVar128 * local_1058._4_4_;
            local_1078[2] = fVar95 * fVar81 - fVar108 * fStack_1050;
            local_1078[3] = fVar97 * fStack_118c - fVar82 * fStack_104c;
            fVar126 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar125 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar104 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar78 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar127 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar107 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_1158._0_4_ = (float)local_1158 - fVar126;
            local_1158._4_4_ = local_1158._4_4_ - fVar126;
            fStack_1150 = fStack_1150 - fVar126;
            fStack_114c = fStack_114c - fVar126;
            local_1148._0_4_ = (float)local_1148 - fVar125;
            local_1148._4_4_ = local_1148._4_4_ - fVar125;
            fStack_1140 = fStack_1140 - fVar125;
            fStack_113c = fStack_113c - fVar125;
            local_1218._0_4_ = fVar23 - fVar104;
            local_1218._4_4_ = fVar96 - fVar104;
            auStack_1210[0] = (uint)(auVar142[0] - fVar104);
            auStack_120c[0] = (uint)(auVar24[0] - fVar104);
            fVar126 = (float)local_1148 * fVar107 - (float)local_1218 * fVar127;
            fVar125 = local_1148._4_4_ * fVar107 - local_1218._4_4_ * fVar127;
            fVar104 = fStack_1140 * fVar107 - (float)auStack_1210[0] * fVar127;
            fVar96 = fStack_113c * fVar107 - (float)auStack_120c[0] * fVar127;
            fVar53 = (float)local_1218 * fVar78 - (float)local_1158 * fVar107;
            fVar54 = local_1218._4_4_ * fVar78 - local_1158._4_4_ * fVar107;
            fVar66 = (float)auStack_1210[0] * fVar78 - fStack_1150 * fVar107;
            fVar83 = (float)auStack_120c[0] * fVar78 - fStack_114c * fVar107;
            fVar129 = (float)local_1158 * fVar127 - (float)local_1148 * fVar78;
            fVar109 = local_1158._4_4_ * fVar127 - local_1148._4_4_ * fVar78;
            fVar133 = fStack_1150 * fVar127 - fStack_1140 * fVar78;
            fVar130 = fStack_114c * fVar127 - fStack_113c * fVar78;
            fVar23 = fVar78 * fVar111 + fVar127 * (float)local_1088._0_4_ + fVar107 * local_1078[0];
            fVar51 = fVar78 * fVar116 + fVar127 * (float)local_1088._4_4_ + fVar107 * local_1078[1];
            fVar52 = fVar78 * fVar118 + fVar127 * fStack_1080 + fVar107 * local_1078[2];
            fVar78 = fVar78 * fVar50 + fVar127 * fStack_107c + fVar107 * local_1078[3];
            uVar49 = (uint)fVar23 & 0x80000000;
            auVar71._8_4_ = (uint)fVar51 & 0x80000000;
            auVar71._12_4_ = (uint)fVar52 & 0x80000000;
            uVar120 = (uint)fVar78 & 0x80000000;
            fVar127 = (float)((uint)((float)local_1068 * fVar126 +
                                    fVar80 * fVar53 + fVar115 * fVar129) ^ uVar49);
            fVar107 = (float)((uint)(local_1068._4_4_ * fVar125 +
                                    fVar128 * fVar54 + fVar117 * fVar109) ^ auVar71._8_4_);
            fVar80 = (float)((uint)(fVar95 * fVar104 + fVar108 * fVar66 + fVar119 * fVar133) ^
                            auVar71._12_4_);
            fVar128 = (float)((uint)(fVar97 * fVar96 + fVar82 * fVar83 + fVar121 * fVar130) ^
                             uVar120);
            auVar90._0_4_ =
                 (float)((uint)(fVar126 * (float)local_1058 + fVar53 * fVar67 + fVar129 * fVar101) ^
                        uVar49);
            auVar90._4_4_ =
                 (float)((uint)(fVar125 * local_1058._4_4_ + fVar54 * fVar79 + fVar109 * fVar102) ^
                        auVar71._8_4_);
            auVar90._8_4_ =
                 (float)((uint)(fVar104 * fStack_1050 + fVar66 * fVar81 + fVar133 * fVar103) ^
                        auVar71._12_4_);
            auVar90._12_4_ =
                 (float)((uint)(fVar96 * fStack_104c + fVar83 * fStack_118c + fVar130 * fVar110) ^
                        uVar120);
            fVar126 = ABS(fVar23);
            fVar125 = ABS(fVar51);
            local_10f8._0_8_ = CONCAT44(fVar51,fVar23) & 0x7fffffff7fffffff;
            local_10f8._8_4_ = ABS(fVar52);
            local_10f8._12_4_ = ABS(fVar78);
            auVar114._0_4_ =
                 -(uint)((0.0 <= fVar127 && 0.0 <= auVar90._0_4_) && fVar23 != 0.0) &
                 (uint)local_1048 & -(uint)(fVar127 + auVar90._0_4_ <= fVar126);
            auVar114._4_4_ =
                 -(uint)((0.0 <= fVar107 && 0.0 <= auVar90._4_4_) && fVar51 != 0.0) &
                 (uint)fStack_1044 & -(uint)(fVar107 + auVar90._4_4_ <= fVar125);
            auVar114._8_4_ =
                 -(uint)((0.0 <= fVar80 && 0.0 <= auVar90._8_4_) && fVar52 != 0.0) & uStack_1040 &
                 -(uint)(fVar80 + auVar90._8_4_ <= local_10f8._8_4_);
            auVar114._12_4_ =
                 -(uint)((0.0 <= fVar128 && 0.0 <= auVar90._12_4_) && fVar78 != 0.0) & uStack_103c &
                 -(uint)(fVar128 + auVar90._12_4_ <= local_10f8._12_4_);
            iVar27 = movmskps(uVar48,auVar114);
            if (iVar27 != 0) {
              local_1108 = (float)(uVar49 ^ (uint)((float)local_1158 * fVar111 +
                                                  (float)local_1148 * (float)local_1088._0_4_ +
                                                  (float)local_1218 * local_1078[0]));
              fStack_1104 = (float)(auVar71._8_4_ ^
                                   (uint)(local_1158._4_4_ * fVar116 +
                                         local_1148._4_4_ * (float)local_1088._4_4_ +
                                         local_1218._4_4_ * local_1078[1]));
              fStack_1100 = (float)(auVar71._12_4_ ^
                                   (uint)(fStack_1150 * fVar118 +
                                         fStack_1140 * fStack_1080 +
                                         (float)auStack_1210[0] * local_1078[2]));
              fStack_10fc = (float)(uVar120 ^
                                   (uint)(fStack_114c * fVar50 +
                                         fStack_113c * fStack_107c +
                                         (float)auStack_120c[0] * local_1078[3]));
              fVar104 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar67 = (ray->super_RayK<1>).tfar;
              uVar48 = -(uint)(local_1108 <= fVar67 * fVar126 && fVar104 * fVar126 < local_1108) &
                       auVar114._0_4_;
              uVar49 = -(uint)(fStack_1104 <= fVar67 * fVar125 && fVar104 * fVar125 < fStack_1104) &
                       auVar114._4_4_;
              auVar71._0_8_ = CONCAT44(uVar49,uVar48);
              auVar71._8_4_ =
                   -(uint)(fStack_1100 <= fVar67 * local_10f8._8_4_ &&
                          fVar104 * local_10f8._8_4_ < fStack_1100) & auVar114._8_4_;
              auVar71._12_4_ =
                   -(uint)(fStack_10fc <= fVar67 * local_10f8._12_4_ &&
                          fVar104 * local_10f8._12_4_ < fStack_10fc) & auVar114._12_4_;
              iVar27 = movmskps(iVar27,auVar71);
              if (iVar27 != 0) {
                local_10d8 = auVar71;
                local_1098 = CONCAT44(fVar116,fVar111);
                uStack_1090 = CONCAT44(fVar50,fVar118);
                local_1128._4_4_ = fVar125 - fVar107;
                local_1128._0_4_ = fVar126 - fVar127;
                fStack_1120 = local_10f8._8_4_ - fVar80;
                fStack_111c = local_10f8._12_4_ - fVar128;
                fStack_1114 = fVar125 - auVar90._4_4_;
                local_1118 = fVar126 - auVar90._0_4_;
                fStack_1110 = local_10f8._8_4_ - auVar90._8_4_;
                fStack_110c = local_10f8._12_4_ - auVar90._12_4_;
                pSVar36 = context->scene;
                uStack_1250 = auVar71._8_4_;
                stack0xffffffffffffeda8 = auVar71._0_8_;
                auStack_124c._0_4_ = auVar71._12_4_;
                auVar68 = rcpps(auVar90,local_10f8);
                fVar104 = auVar68._0_4_;
                fVar67 = auVar68._4_4_;
                fVar78 = auVar68._8_4_;
                fVar96 = auVar68._12_4_;
                fVar104 = (1.0 - fVar126 * fVar104) * fVar104 + fVar104;
                fVar67 = (1.0 - fVar125 * fVar67) * fVar67 + fVar67;
                fVar78 = (1.0 - local_10f8._8_4_ * fVar78) * fVar78 + fVar78;
                fVar96 = (1.0 - local_10f8._12_4_ * fVar96) * fVar96 + fVar96;
                local_10a8[0] = local_1108 * fVar104;
                local_10a8[1] = fStack_1104 * fVar67;
                local_10a8[2] = fStack_1100 * fVar78;
                local_10a8[3] = fStack_10fc * fVar96;
                local_10c8[0] = (fVar126 - fVar127) * fVar104;
                local_10c8[1] = (fVar125 - fVar107) * fVar67;
                local_10c8[2] = (local_10f8._8_4_ - fVar80) * fVar78;
                local_10c8[3] = (local_10f8._12_4_ - fVar128) * fVar96;
                local_10b8[0] = fVar104 * (fVar126 - auVar90._0_4_);
                local_10b8[1] = fVar67 * (fVar125 - auVar90._4_4_);
                local_10b8[2] = fVar78 * (local_10f8._8_4_ - auVar90._8_4_);
                local_10b8[3] = fVar96 * (local_10f8._12_4_ - auVar90._12_4_);
                auVar92._0_4_ = (uint)(local_1108 * fVar104) & uVar48;
                auVar92._4_4_ = (uint)(fStack_1104 * fVar67) & uVar49;
                auVar92._8_4_ = (uint)(fStack_1100 * fVar78) & auVar71._8_4_;
                auVar92._12_4_ = (uint)(fStack_10fc * fVar96) & auVar71._12_4_;
                auVar76._0_8_ = CONCAT44(~uVar49,~uVar48) & 0x7f8000007f800000;
                auVar76._8_4_ = ~auVar71._8_4_ & 0x7f800000;
                auVar76._12_4_ = ~auVar71._12_4_ & 0x7f800000;
                auVar76 = auVar76 | auVar92;
                auVar93._4_4_ = auVar76._0_4_;
                auVar93._0_4_ = auVar76._4_4_;
                auVar93._8_4_ = auVar76._12_4_;
                auVar93._12_4_ = auVar76._8_4_;
                auVar68 = minps(auVar93,auVar76);
                auVar61._0_8_ = auVar68._8_8_;
                auVar61._8_4_ = auVar68._0_4_;
                auVar61._12_4_ = auVar68._4_4_;
                auVar68 = minps(auVar61,auVar68);
                auVar62._0_4_ = -(uint)(auVar68._0_4_ == auVar76._0_4_) & uVar48;
                auVar62._4_4_ = -(uint)(auVar68._4_4_ == auVar76._4_4_) & uVar49;
                auVar62._8_4_ = -(uint)(auVar68._8_4_ == auVar76._8_4_) & auVar71._8_4_;
                auVar62._12_4_ = -(uint)(auVar68._12_4_ == auVar76._12_4_) & auVar71._12_4_;
                iVar27 = movmskps(iVar27,auVar62);
                if (iVar27 != 0) {
                  uVar48 = auVar62._0_4_;
                  uVar49 = auVar62._4_4_;
                  auVar71._8_4_ = auVar62._8_4_;
                  auVar71._12_4_ = auVar62._12_4_;
                }
                auVar18._4_4_ = uVar49;
                auVar18._0_4_ = uVar48;
                auVar18._8_4_ = auVar71._8_4_;
                auVar18._12_4_ = auVar71._12_4_;
                uVar28 = movmskps(iVar27,auVar18);
                lVar29 = 0;
                if (CONCAT44(uVar34,uVar28) != 0) {
                  for (; (CONCAT44(uVar34,uVar28) >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
LAB_00df4a2d:
                uVar48 = puVar43[lVar29];
                pRVar31 = (RayHit *)(ulong)uVar48;
                local_1068 = (pSVar36->geometries).items[(long)pRVar31].ptr;
                if ((local_1068->mask & (ray->super_RayK<1>).mask) == 0) {
                  *(undefined4 *)(local_125c + lVar29 * 4 + 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_1068->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar126 = local_10c8[lVar29];
                    fVar125 = local_10b8[lVar29];
                    (ray->super_RayK<1>).tfar = local_10a8[lVar29];
                    (ray->Ng).field_0.field_0.x = *(float *)((long)&local_1098 + lVar29 * 4);
                    (ray->Ng).field_0.field_0.y = local_1078[lVar29 + -4];
                    (ray->Ng).field_0.field_0.z = local_1078[lVar29];
                    ray->u = fVar126;
                    ray->v = fVar125;
                    ray->primID = *(uint *)(lVar33 + 0x50 + lVar29 * 4);
                    ray->geomID = uVar48;
                    pRVar17 = context->user;
                    ray->instID[0] = pRVar17->instID[0];
                    ray->instPrimID[0] = pRVar17->instPrimID[0];
                    goto LAB_00df44bb;
                  }
                  local_1218 = context->args;
                  local_1148 = pSVar36;
                  auStack_124c._12_8_ = lVar40;
                  local_1238 = uVar38;
                  local_1208 = SUB84(pauVar41,0);
                  fStack_1204 = (float)((ulong)pauVar41 >> 0x20);
                  local_11f8 = context;
                  local_11e8.context = context->user;
                  local_11b8 = lVar33;
                  local_1188 = *(float *)((long)&local_1098 + lVar29 * 4);
                  local_1184 = local_1078[lVar29 + -4];
                  local_1180 = local_1078[lVar29];
                  local_117c = local_10c8[lVar29];
                  local_1178 = local_10b8[lVar29];
                  local_1174 = *(undefined4 *)(lVar33 + 0x50 + lVar29 * 4);
                  local_1170 = uVar48;
                  local_116c = (local_11e8.context)->instID[0];
                  local_1168 = (local_11e8.context)->instPrimID[0];
                  local_1158._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = local_10a8[lVar29];
                  local_125c._0_4_ = -NAN;
                  local_11e8.valid = (int *)local_125c;
                  local_11e8.geometryUserPtr = local_1068->userPtr;
                  local_11e8.ray = (RTCRayN *)ray;
                  local_11e8.hit = (RTCHitN *)&local_1188;
                  local_11e8.N = 1;
                  if ((local_1068->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*local_1068->intersectionFilterN)(&local_11e8),
                     (((RayK<1> *)local_11e8.valid)->org).field_0.m128[0] != 0.0)) {
                    if (local_1218->filter != (RTCFilterFunctionN)0x0) {
                      if (((local_1218->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((local_1068->field_8).field_0x2 & 0x40) != 0)) {
                        (*local_1218->filter)(&local_11e8);
                      }
                      if ((((RayK<1> *)local_11e8.valid)->org).field_0.m128[0] == 0.0)
                      goto LAB_00df4c9c;
                    }
                    (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_11e8.hit;
                    (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_11e8.hit + 4);
                    (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_11e8.hit + 8);
                    *(float *)((long)local_11e8.ray + 0x3c) = *(float *)(local_11e8.hit + 0xc);
                    *(float *)((long)local_11e8.ray + 0x40) = *(float *)(local_11e8.hit + 0x10);
                    *(float *)((long)local_11e8.ray + 0x44) = *(float *)(local_11e8.hit + 0x14);
                    *(float *)((long)local_11e8.ray + 0x48) = *(float *)(local_11e8.hit + 0x18);
                    *(float *)((long)local_11e8.ray + 0x4c) = *(float *)(local_11e8.hit + 0x1c);
                    *(float *)((long)local_11e8.ray + 0x50) = *(float *)(local_11e8.hit + 0x20);
                    pRVar31 = (RayHit *)local_11e8.ray;
                  }
                  else {
LAB_00df4c9c:
                    (ray->super_RayK<1>).tfar = (float)local_1158;
                    pRVar31 = (RayHit *)local_11e8.valid;
                  }
                  *(undefined4 *)(local_125c + lVar29 * 4 + 4) = 0;
                  fVar126 = (ray->super_RayK<1>).tfar;
                  uStack_1254 = -(uint)(local_10a8[1] <= fVar126) & uStack_1254;
                  local_125c._4_4_ = -(uint)(local_10a8[0] <= fVar126) & local_125c._4_4_;
                  uStack_1250 = -(uint)(local_10a8[2] <= fVar126) & uStack_1250;
                  auStack_124c._0_4_ = -(uint)(local_10a8[3] <= fVar126) & auStack_124c._0_4_;
                  pauVar41 = (undefined1 (*) [16])CONCAT44(fStack_1204,local_1208);
                  lVar33 = local_11b8;
                  pSVar36 = local_1148;
                  uVar38 = local_1238;
                  lVar40 = auStack_124c._12_8_;
                  context = local_11f8;
                }
                uVar48 = local_125c._4_4_;
                uVar49 = local_125c._8_4_;
                auVar71._8_4_ = local_125c._12_4_;
                auVar71._12_4_ = local_125c._16_4_;
                iVar27 = movmskps((int)pRVar31,stack0xffffffffffffeda8);
                if (iVar27 == 0) goto LAB_00df44bb;
                auVar63._0_4_ = (uint)local_10a8[0] & uVar48;
                auVar63._4_4_ = (uint)local_10a8[1] & uVar49;
                auVar63._8_4_ = (uint)local_10a8[2] & auVar71._8_4_;
                auVar63._12_4_ = (uint)local_10a8[3] & auVar71._12_4_;
                auVar77._0_8_ = CONCAT44(~uVar49,~uVar48) & 0x7f8000007f800000;
                auVar77._8_4_ = ~auVar71._8_4_ & 0x7f800000;
                auVar77._12_4_ = ~auVar71._12_4_ & 0x7f800000;
                auVar77 = auVar77 | auVar63;
                auVar94._4_4_ = auVar77._0_4_;
                auVar94._0_4_ = auVar77._4_4_;
                auVar94._8_4_ = auVar77._12_4_;
                auVar94._12_4_ = auVar77._8_4_;
                auVar68 = minps(auVar94,auVar77);
                auVar64._0_8_ = auVar68._8_8_;
                auVar64._8_4_ = auVar68._0_4_;
                auVar64._12_4_ = auVar68._4_4_;
                auVar68 = minps(auVar64,auVar68);
                auVar65._0_4_ = -(uint)(auVar68._0_4_ == auVar77._0_4_) & uVar48;
                auVar65._4_4_ = -(uint)(auVar68._4_4_ == auVar77._4_4_) & uVar49;
                auVar65._8_4_ = -(uint)(auVar68._8_4_ == auVar77._8_4_) & auVar71._8_4_;
                auVar65._12_4_ = -(uint)(auVar68._12_4_ == auVar77._12_4_) & auVar71._12_4_;
                iVar27 = movmskps(iVar27,auVar65);
                if (iVar27 != 0) {
                  uVar48 = auVar65._0_4_;
                  uVar49 = auVar65._4_4_;
                  auVar71._8_4_ = auVar65._8_4_;
                  auVar71._12_4_ = auVar65._12_4_;
                }
                auVar19._4_4_ = uVar49;
                auVar19._0_4_ = uVar48;
                auVar19._8_4_ = auVar71._8_4_;
                auVar19._12_4_ = auVar71._12_4_;
                uVar34 = movmskps(iVar27,auVar19);
                uVar32 = CONCAT44((int)((ulong)pRVar31 >> 0x20),uVar34);
                lVar29 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                goto LAB_00df4a2d;
              }
            }
LAB_00df44bb:
            lVar47 = lVar47 + 1;
          } while (lVar47 != lVar40);
        }
        fVar107 = (ray->super_RayK<1>).tfar;
        uVar32 = local_1028;
        uVar35 = local_1220;
        uVar37 = local_1228;
        uVar42 = local_1020;
        uVar46 = local_1230;
        fVar126 = fVar107;
        fVar125 = fVar107;
        fVar104 = fVar107;
        auVar68 = local_1008;
        fVar67 = local_fb8;
        fVar78 = fStack_fb4;
        fVar127 = fStack_fb0;
        fVar96 = fStack_fac;
        fVar79 = local_fc8;
        fVar80 = fStack_fc4;
        fVar128 = fStack_fc0;
        fVar108 = fStack_fbc;
        fVar82 = local_fd8;
        fVar129 = fStack_fd4;
        fVar109 = fStack_fd0;
        fVar133 = fStack_fcc;
        fVar130 = local_fe8;
        fVar111 = fStack_fe4;
        fVar116 = fStack_fe0;
        fVar23 = fStack_fdc;
        fVar118 = local_1018;
        fVar81 = fStack_1014;
        fVar50 = fStack_1010;
        fVar51 = fStack_100c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }